

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

typed_address<pstore::trailer> __thiscall
pstore::database::older_revision_footer_pos(database *this,uint revision)

{
  uint uVar1;
  typed_address<pstore::trailer> pos;
  shared_ptr<const_pstore::trailer> tail;
  
  if (revision != 0xffffffff) {
    uVar1 = get_current_revision(this);
    if (revision <= uVar1) {
      pos.a_.a_ = (address)(this->size_).footer_pos_.a_.a_;
      do {
        getro<pstore::trailer,void>((database *)&tail,(typed_address<pstore::trailer>)this);
        uVar1 = ((tail.super___shared_ptr<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->a).generation.super___atomic_base<unsigned_int>._M_i;
        if (uVar1 < revision) {
          raise<pstore::error_code>(unknown_revision);
        }
        if (uVar1 != revision) {
          pos.a_.a_ = (address)((tail.
                                 super___shared_ptr<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->a).prev_generation.a_.a_;
          trailer::validate(this,pos);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&tail.super___shared_ptr<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      } while (uVar1 != revision);
      return (address)pos.a_.a_;
    }
  }
  raise<pstore::error_code>(unknown_revision);
}

Assistant:

typed_address<trailer> database::older_revision_footer_pos (unsigned const revision) const {
        if (revision == pstore::head_revision || revision > this->get_current_revision ()) {
            raise (pstore::error_code::unknown_revision);
        }

        // Walk backwards down the linked list of revisions to find it.
        typed_address<trailer> footer_pos = size_.footer_pos ();
        for (;;) {
            auto const tail = this->getro (footer_pos);
            unsigned int const tail_revision = tail->a.generation;
            if (revision > tail_revision) {
                raise (pstore::error_code::unknown_revision);
            }
            if (tail_revision == revision) {
                break;
            }

            // TODO: check that footer_pos and generation number are getting smaller; time must
            // not be getting larger.
            footer_pos = tail->a.prev_generation;
            trailer::validate (*this, footer_pos);
        }

        return footer_pos;
    }